

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::ImageCopyToImage::prepare
          (ImageCopyToImage *this,PrepareContext *context)

{
  Move<vk::Handle<(vk::HandleType)9>_> *this_00;
  Context *pCVar1;
  InstanceInterface *vki;
  DeviceInterface *vk;
  VkDevice device;
  deUint64 dVar2;
  Handle<(vk::HandleType)7> HVar3;
  VkResult result;
  VkCommandBufferLevel level;
  VkDevice pVVar4;
  VkMemoryPropertyFlags in_stack_fffffffffffffec8;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_108;
  VkQueue local_e0;
  VkCommandPool local_d8;
  VkPhysicalDevice local_d0;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_c8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  undefined1 local_88 [16];
  VkDevice local_78;
  VkCommandPool VStack_70;
  deUint32 local_68;
  deUint32 dStack_64;
  deUint32 dStack_60;
  deUint32 dStack_5c;
  VkSampleCountFlagBits VStack_58;
  undefined8 uStack_54;
  VkSharingMode VStack_4c;
  deUint32 local_48;
  pointer local_40;
  VkImageLayout local_38;
  
  pCVar1 = context->m_context;
  vki = pCVar1->m_vki;
  vk = pCVar1->m_vkd;
  local_d0 = pCVar1->m_physicalDevice;
  device = pCVar1->m_device;
  local_e0 = pCVar1->m_queue;
  local_d8.m_internal =
       (pCVar1->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
       m_internal;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,
             &pCVar1->m_queueFamilies);
  VStack_70.m_internal._4_4_ = context->m_currentImageWidth;
  this->m_imageWidth = VStack_70.m_internal._4_4_;
  local_68 = context->m_currentImageHeight;
  this->m_imageHeight = local_68;
  this->m_imageMemorySize = context->m_currentImageMemorySize;
  local_88._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88._8_8_ = (DeviceInterface *)0x0;
  local_78 = (VkDevice)&DAT_100000000;
  VStack_70.m_internal._0_4_ = VK_FORMAT_R8G8B8A8_UNORM;
  dStack_64 = 1;
  dStack_60 = 1;
  dStack_5c = 1;
  VStack_58 = VK_SAMPLE_COUNT_1_BIT;
  uStack_54._0_4_ = VK_IMAGE_TILING_OPTIMAL;
  uStack_54._4_4_ = 3;
  VStack_4c = VK_SHARING_MODE_EXCLUSIVE;
  local_48 = (deUint32)
             ((ulong)((long)local_a0._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a0._M_impl.super__Vector_impl_data._M_start) >> 2);
  local_40 = local_a0._M_impl.super__Vector_impl_data._M_start;
  local_38 = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_c8,vk,device,
                    (VkImageCreateInfo *)local_88,(VkAllocationCallbacks *)0x0);
  local_108.m_data.deleter.m_device = local_c8.m_data.deleter.m_device;
  local_108.m_data.deleter.m_allocator = local_c8.m_data.deleter.m_allocator;
  local_108.m_data.object.m_internal = local_c8.m_data.object.m_internal;
  local_108.m_data.deleter.m_deviceIface = local_c8.m_data.deleter.m_deviceIface;
  local_c8.m_data.object.m_internal = 0;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_dstImage;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       local_108.m_data.deleter.m_device;
  (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       local_108.m_data.deleter.m_allocator;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
       local_108.m_data.object.m_internal;
  (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       local_108.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_c8);
  pVVar4 = device;
  bindImageMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&local_108,vki,vk,local_d0,device,
                  (VkImage)(this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                           m_internal,in_stack_fffffffffffffec8);
  level = (VkCommandBufferLevel)pVVar4;
  local_78 = local_108.m_data.deleter.m_device;
  VStack_70.m_internal = (deUint64)local_108.m_data.deleter.m_allocator;
  local_88._0_8_ = local_108.m_data.object.m_internal;
  local_88._8_8_ = local_108.m_data.deleter.m_deviceIface;
  local_108.m_data.object.m_internal = 0;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_108.m_data.deleter.m_device = (VkDevice)0x0;
  local_108.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::reset
            (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = local_78;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_70.m_internal;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       local_88._0_8_;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_88._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_108);
  createBeginCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)local_88,vk,device,local_d8,level);
  local_108.m_data.deleter.m_device = local_78;
  local_108.m_data.deleter.m_allocator = (VkAllocationCallbacks *)VStack_70.m_internal;
  local_108.m_data.object.m_internal = local_88._0_8_;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)local_88._8_8_;
  local_88._0_8_ = (VkCommandBuffer_s *)0x0;
  local_88._8_8_ = (DeviceInterface *)0x0;
  local_78 = (VkDevice)0x0;
  VStack_70.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_88);
  HVar3.m_internal = local_108.m_data.object.m_internal;
  local_88._0_4_ = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  local_88._8_8_ = (DeviceInterface *)0x0;
  local_78 = (VkDevice)0x100000000000;
  VStack_70.m_internal = 0x700000000;
  local_68 = 0xffffffff;
  dStack_64 = 0xffffffff;
  dVar2 = (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  dStack_60 = (deUint32)dVar2;
  dStack_5c = (deUint32)(dVar2 >> 0x20);
  VStack_58 = VK_SAMPLE_COUNT_1_BIT;
  uStack_54._0_4_ = VK_IMAGE_TILING_OPTIMAL;
  uStack_54._4_4_ = 1;
  VStack_4c = VK_SHARING_MODE_EXCLUSIVE;
  local_48 = 1;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_108.m_data.object.m_internal,0x10000,0x1000,0,0,0,0,0,1,
             (RefBase<vk::VkCommandBuffer_s_*> *)local_88);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,HVar3.m_internal);
  ::vk::checkResult(result,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xd8f);
  queueRun(vk,local_e0,(VkCommandBuffer)local_108.m_data.object.m_internal);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_108);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a0);
  return;
}

Assistant:

void ImageCopyToImage::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vk::VkQueue				queue			= context.getContext().getQueue();
	const vk::VkCommandPool			commandPool		= context.getContext().getCommandPool();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_imageWidth		= context.getImageWidth();
	m_imageHeight		= context.getImageHeight();
	m_imageMemorySize	= context.getImageMemorySize();

	{
		const vk::VkImageCreateInfo	createInfo =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,

			0,
			vk::VK_IMAGE_TYPE_2D,
			vk::VK_FORMAT_R8G8B8A8_UNORM,
			{
				(deUint32)m_imageWidth,
				(deUint32)m_imageHeight,
				1u,
			},
			1, 1, // mipLevels, arrayLayers
			vk::VK_SAMPLE_COUNT_1_BIT,

			vk::VK_IMAGE_TILING_OPTIMAL,
			vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
			vk::VK_SHARING_MODE_EXCLUSIVE,

			(deUint32)queueFamilies.size(),
			&queueFamilies[0],
			vk::VK_IMAGE_LAYOUT_UNDEFINED
		};

		m_dstImage = vk::createImage(vkd, device, &createInfo);
	}

	m_memory = bindImageMemory(vki, vkd, physicalDevice, device, *m_dstImage, 0);

	{
		const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
		const vk::VkImageMemoryBarrier			barrier			=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			0,
			vk::VK_ACCESS_TRANSFER_WRITE_BIT,

			vk::VK_IMAGE_LAYOUT_UNDEFINED,
			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_dstImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &barrier);

		VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
		queueRun(vkd, queue, *commandBuffer);
	}
}